

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-test.c++
# Opt level: O2

void __thiscall capnp::compiler::anon_unknown_0::TestCase361::run(TestCase361 *this)

{
  int iVar1;
  char *__s2;
  StringPtr constText;
  StringPtr constText_00;
  Array<char> local_30;
  char *local_18;
  
  constText.content.size_ = 0x11;
  constText.content.ptr = anon_var_dwarf_278a42;
  doLex<capnp::compiler::LexedTokens>((String *)&local_30,constText);
  __s2 = local_30.ptr;
  if (local_30.size_ == 0) {
    __s2 = "";
  }
  iVar1 = strcmp("(tokens = [(identifier = \'foo\', startByte = 3, endByte = 6), (identifier = \'bar\', startByte = 7, endByte = 10), (identifier = \'baz\', startByte = 13, endByte = 16)])"
                 ,__s2);
  kj::Array<char>::~Array(&local_30);
  if ((iVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_00.content.size_ = 0x11;
    constText_00.content.ptr = anon_var_dwarf_278a42;
    doLex<capnp::compiler::LexedTokens>((String *)&local_30,constText_00);
    if (local_30.size_ == 0) {
      local_30.ptr = "";
    }
    local_18 = local_30.ptr;
    kj::_::Debug::log<char_const(&)[280],char_const(&)[165],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x170,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(tokens = [\\\" \\\"(identifier = \'foo\', startByte = 3, endByte = 6), \\\" \\\"(identifier = \'bar\', startByte = 7, endByte = 10), \\\" \\\"(identifier = \'baz\', startByte = 13, endByte = 16)\\\" \\\"])\\\", doLex<LexedTokens>(\\\"\\\\xef\\\\xbb\\\\xbf\\\"\\\"foo bar\\\\xef\\\\xbb\\\\xbf\\\"\\\"baz\\\").cStr()) == 0\", \"(tokens = [\" \"(identifier = \'foo\', startByte = 3, endByte = 6), \" \"(identifier = \'bar\', startByte = 7, endByte = 10), \" \"(identifier = \'baz\', startByte = 13, endByte = 16)\" \"])\", doLex<LexedTokens>(\"\\xef\\xbb\\xbf\"\"foo bar\\xef\\xbb\\xbf\"\"baz\").cStr()"
               ,(char (*) [280])
                "failed: expected ::strcmp(\"(tokens = [\" \"(identifier = \'foo\', startByte = 3, endByte = 6), \" \"(identifier = \'bar\', startByte = 7, endByte = 10), \" \"(identifier = \'baz\', startByte = 13, endByte = 16)\" \"])\", doLex<LexedTokens>(\"\\xef\\xbb\\xbf\"\"foo bar\\xef\\xbb\\xbf\"\"baz\").cStr()) == 0"
               ,(char (*) [165])
                "(tokens = [(identifier = \'foo\', startByte = 3, endByte = 6), (identifier = \'bar\', startByte = 7, endByte = 10), (identifier = \'baz\', startByte = 13, endByte = 16)])"
               ,&local_18);
    kj::Array<char>::~Array(&local_30);
  }
  return;
}

Assistant:

TEST(Lexer, Utf8Bom) {
  EXPECT_STREQ(
      "(tokens = ["
        "(identifier = 'foo', startByte = 3, endByte = 6), "
        "(identifier = 'bar', startByte = 7, endByte = 10), "
        "(identifier = 'baz', startByte = 13, endByte = 16)"
      "])",
      doLex<LexedTokens>("\xef\xbb\xbf""foo bar\xef\xbb\xbf""baz").cStr());
}